

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

_Bool Hacl_P256_validate_private_key(uint8_t *private_key)

{
  uint64_t uVar1;
  uint64_t res;
  uint64_t bn_sk [4];
  uint8_t *private_key_local;
  
  memset(&res,0,0x20);
  bn_from_bytes_be4(&res,private_key);
  uVar1 = bn_is_lt_order_and_gt_zero_mask4(&res);
  return uVar1 == 0xffffffffffffffff;
}

Assistant:

bool Hacl_P256_validate_private_key(uint8_t *private_key)
{
  uint64_t bn_sk[4U] = { 0U };
  bn_from_bytes_be4(bn_sk, private_key);
  uint64_t res = bn_is_lt_order_and_gt_zero_mask4(bn_sk);
  return res == 0xFFFFFFFFFFFFFFFFULL;
}